

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

bool __thiscall cmELF::GetSOName(cmELF *this,string *soname)

{
  StringEntry *pSVar1;
  StringEntry *se;
  string *soname_local;
  cmELF *this_local;
  
  pSVar1 = GetSOName(this);
  if (pSVar1 != (StringEntry *)0x0) {
    std::__cxx11::string::operator=((string *)soname,(string *)pSVar1);
  }
  return pSVar1 != (StringEntry *)0x0;
}

Assistant:

bool cmELF::GetSOName(std::string& soname)
{
  if(StringEntry const* se = this->GetSOName())
    {
    soname = se->Value;
    return true;
    }
  else
    {
    return false;
    }
}